

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase495::run(TestCase495 *this)

{
  int iVar1;
  undefined4 extraout_var;
  Own<kj::ConnectionReceiver> listener;
  int originalDirFd;
  Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_test_c__:508:3)>
  _kjDefer508;
  Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_test_c__:506:3)>
  _kjDefer506;
  Own<kj::NetworkAddress> addr;
  Own<kj::ConnectionReceiver> local_70;
  Own<kj::_::PromiseNode> local_60;
  Own<kj::AsyncIoStream> local_50;
  AsyncIoContext ioContext;
  
  setupAsyncIo();
  iVar1 = (*(ioContext.provider.ptr)->_vptr_AsyncIoProvider[3])();
  (*(code *)**(undefined8 **)CONCAT44(extraout_var,iVar1))
            (&listener,(undefined8 *)CONCAT44(extraout_var,iVar1),"unix-abstract:foo",0x12,0);
  Promise<kj::Own<kj::NetworkAddress>_>::wait
            ((Promise<kj::Own<kj::NetworkAddress>_> *)&addr,&listener);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&listener);
  (*(addr.ptr)->_vptr_NetworkAddress[1])(&listener);
  do {
    originalDirFd = open(".",0x90000);
    if (-1 < originalDirFd) goto LAB_0021b361;
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    _::Debug::Fault::Fault
              ((Fault *)&_kjDefer506,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x1f9,iVar1,"originalDirFd = open(\".\", O_RDONLY | O_DIRECTORY | O_CLOEXEC)","");
    _::Debug::Fault::fatal((Fault *)&_kjDefer506);
  }
LAB_0021b361:
  _kjDefer506.canceled = false;
  _kjDefer506.func.originalDirFd = &originalDirFd;
  do {
    iVar1 = chdir("/");
    if (-1 < iVar1) goto LAB_0021b397;
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    _::Debug::Fault::Fault
              ((Fault *)&_kjDefer508,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x1fb,iVar1,"chdir(\"/\")","");
    _::Debug::Fault::fatal((Fault *)&_kjDefer508);
  }
LAB_0021b397:
  _kjDefer508.canceled = false;
  _kjDefer508.func.originalDirFd = &originalDirFd;
  (**(addr.ptr)->_vptr_NetworkAddress)(&local_70);
  Promise<kj::Own<kj::AsyncIoStream>>::attach<kj::Own<kj::ConnectionReceiver>>
            ((Promise<kj::Own<kj::AsyncIoStream>> *)&local_60,&local_70);
  Promise<kj::Own<kj::AsyncIoStream>_>::wait
            ((Promise<kj::Own<kj::AsyncIoStream>_> *)&local_50,&local_60);
  Own<kj::AsyncIoStream>::dispose(&local_50);
  Own<kj::_::PromiseNode>::dispose(&local_60);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_70);
  _::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++:508:3)>
  ::~Deferred(&_kjDefer508);
  _::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++:506:3)>
  ::~Deferred(&_kjDefer506);
  Own<kj::ConnectionReceiver>::dispose(&listener);
  Own<kj::NetworkAddress>::dispose(&addr);
  AsyncIoContext::~AsyncIoContext(&ioContext);
  return;
}

Assistant:

TEST(AsyncIo, AbstractUnixSocket) {
  auto ioContext = setupAsyncIo();
  auto& network = ioContext.provider->getNetwork();

  Own<NetworkAddress> addr = network.parseAddress("unix-abstract:foo").wait(ioContext.waitScope);

  Own<ConnectionReceiver> listener = addr->listen();
  // chdir proves no filesystem dependence. Test fails for regular unix socket
  // but passes for abstract unix socket.
  int originalDirFd;
  KJ_SYSCALL(originalDirFd = open(".", O_RDONLY | O_DIRECTORY | O_CLOEXEC));
  KJ_DEFER(close(originalDirFd));
  KJ_SYSCALL(chdir("/"));
  KJ_DEFER(KJ_SYSCALL(fchdir(originalDirFd)));

  addr->connect().attach(kj::mv(listener)).wait(ioContext.waitScope);
}